

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O3

Vec_Ptr_t * Aig_ManPartitionSmartRegisters(Aig_Man_t *pAig,int nSuppSizeLimit,int fVerbose)

{
  ulong uVar1;
  uint nPis;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  uint *__ptr;
  void *pvVar7;
  Vec_Ptr_t *pVVar8;
  void **ppvVar9;
  Vec_Int_t *pVVar10;
  int *piVar11;
  uint *puVar12;
  uint uVar13;
  long lVar14;
  long lVar15;
  Vec_Ptr_t *vPartsAll;
  Aig_Man_t *pAVar16;
  Vec_Int_t *pVVar17;
  Vec_Ptr_t *pVVar18;
  ulong uVar19;
  int iVar20;
  size_t sVar21;
  ulong uVar22;
  ulong uVar23;
  timespec ts;
  timespec local_98;
  int local_84;
  ulong local_80;
  ulong local_78;
  Vec_Ptr_t *local_70;
  Vec_Int_t *local_68;
  Vec_Ptr_t *local_60;
  long local_58;
  ulong local_50;
  Vec_Ptr_t *local_48;
  Vec_Ptr_t *local_40;
  ulong local_38;
  
  local_84 = nSuppSizeLimit;
  iVar2 = clock_gettime(3,&local_98);
  if (iVar2 < 0) {
    lVar14 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    lVar14 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  pAVar16 = pAig;
  local_70 = Aig_ManSupportsRegisters(pAig);
  iVar2 = (int)pAVar16;
  nPis = local_70->nSize;
  pVVar18 = (Vec_Ptr_t *)(ulong)nPis;
  if (nPis != pAig->nRegs) {
    __assert_fail("Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                  ,0x336,"Vec_Ptr_t *Aig_ManPartitionSmartRegisters(Aig_Man_t *, int, int)");
  }
  if (0 < (int)nPis) {
    ppvVar6 = local_70->pArray;
    pVVar5 = (Vec_Ptr_t *)0x0;
    do {
      pVVar17 = (Vec_Int_t *)ppvVar6[(long)pVVar5];
      Vec_IntPush(pVVar17,(int)pVVar5);
      iVar2 = (int)pVVar17;
      pVVar5 = (Vec_Ptr_t *)((long)&pVVar5->nCap + 1);
    } while (pVVar18 != pVVar5);
  }
  if (fVerbose != 0) {
    Abc_Print(iVar2,"%s =","Supps");
    iVar20 = 3;
    iVar2 = clock_gettime(3,&local_98);
    if (iVar2 < 0) {
      lVar15 = -1;
    }
    else {
      lVar15 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    Abc_Print(iVar20,"%9.2f sec\n",(double)(lVar15 + lVar14) / 1000000.0);
  }
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 1000;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(8000);
  pVVar5->pArray = ppvVar6;
  iVar2 = clock_gettime(3,&local_98);
  if (iVar2 < 0) {
    local_58 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_98.tv_nsec),8);
    local_58 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_98.tv_sec * -1000000;
  }
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 0x100;
  __ptr[1] = 0;
  pvVar7 = malloc(0x800);
  *(void **)(__ptr + 2) = pvVar7;
  pVVar8 = (Vec_Ptr_t *)malloc(0x10);
  pVVar8->nCap = 0x100;
  pVVar8->nSize = 0;
  ppvVar9 = (void **)malloc(0x800);
  pVVar8->pArray = ppvVar9;
  local_40 = pVVar8;
  if ((int)nPis < 1) {
    uVar19 = 0;
    uVar3 = 0;
LAB_006c74e4:
    if (ppvVar6 != (void **)0x0) goto LAB_006c74e9;
  }
  else {
    uVar22 = 0;
    local_80 = 0x100;
    local_78 = 1000;
    local_50 = 0x100;
    uVar4 = 0;
    vPartsAll = (Vec_Ptr_t *)0x0;
    local_48 = pVVar5;
    uVar13 = 0;
    do {
      pVVar17 = (Vec_Int_t *)local_70->pArray[(long)vPartsAll];
      local_60 = vPartsAll;
      local_38 = uVar22;
      if (pVVar17->nSize < 1) goto LAB_006c77f4;
      uVar3 = pVVar17->nSize - 1;
      pVVar17->nSize = uVar3;
      iVar2 = pVVar17->pArray[uVar3];
      uVar3 = Aig_ManPartitionSmartFindPart(pVVar8,vPartsAll,pVVar5,local_84,pVVar17);
      if (uVar3 == 0xffffffff) {
        pVVar10 = (Vec_Int_t *)malloc(0x10);
        pVVar10->nCap = 0x20;
        pVVar10->nSize = 0;
        piVar11 = (int *)malloc(0x80);
        pVVar10->pArray = piVar11;
        Vec_IntPush(pVVar10,iVar2);
        piVar11 = (int *)malloc(0x10);
        iVar2 = pVVar17->nSize;
        piVar11[1] = iVar2;
        *piVar11 = iVar2;
        local_68 = pVVar17;
        if ((long)iVar2 == 0) {
          sVar21 = 0;
          pvVar7 = (void *)0x0;
        }
        else {
          sVar21 = (long)iVar2 << 2;
          pvVar7 = malloc(sVar21);
        }
        uVar19 = local_80;
        *(void **)(piVar11 + 2) = pvVar7;
        memcpy(pvVar7,local_68->pArray,sVar21);
        uVar3 = (uint)local_50;
        if (uVar13 == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(0x80);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
            }
            *(void **)(__ptr + 2) = pvVar7;
            *__ptr = 0x10;
            local_50 = 0x10;
          }
          else {
            uVar3 = uVar3 * 2;
            sVar21 = (ulong)uVar3 * 8;
            if (*(void **)(__ptr + 2) == (void *)0x0) {
              pvVar7 = malloc(sVar21);
            }
            else {
              pvVar7 = realloc(*(void **)(__ptr + 2),sVar21);
            }
            *(void **)(__ptr + 2) = pvVar7;
            *__ptr = uVar3;
            local_50 = (ulong)uVar3;
          }
        }
        else {
          pvVar7 = *(void **)(__ptr + 2);
        }
        pVVar5 = local_48;
        uVar3 = uVar13 + 1;
        __ptr[1] = uVar3;
        *(Vec_Int_t **)((long)pvVar7 + (long)(int)uVar13 * 8) = pVVar10;
        uVar13 = (uint)uVar19;
        if (uVar4 == uVar13) {
          if ((int)uVar13 < 0x10) {
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar8->pArray,0x80);
            }
            pVVar8->pArray = ppvVar6;
            pVVar8->nCap = 0x10;
            local_80 = 0x10;
          }
          else {
            uVar13 = uVar13 * 2;
            sVar21 = (ulong)uVar13 * 8;
            if (pVVar8->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(sVar21);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar8->pArray,sVar21);
            }
            pVVar8->pArray = ppvVar6;
            pVVar8->nCap = uVar13;
            local_80 = (ulong)uVar13;
          }
        }
        else {
          ppvVar6 = pVVar8->pArray;
        }
        pVVar8->nSize = uVar4 + 1;
        ppvVar6[(int)uVar4] = piVar11;
        puVar12 = Aig_ManSuppCharStart(local_68,nPis);
        iVar2 = (int)local_78;
        if ((int)local_38 == iVar2) {
          if (iVar2 < 0x10) {
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(0x80);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = 0x10;
            local_78 = 0x10;
          }
          else {
            local_78 = (ulong)(uint)(iVar2 * 2);
            if (pVVar5->pArray == (void **)0x0) {
              ppvVar6 = (void **)malloc(local_78 * 8);
            }
            else {
              ppvVar6 = (void **)realloc(pVVar5->pArray,local_78 * 8);
            }
            pVVar5->pArray = ppvVar6;
            pVVar5->nCap = (int)local_78;
          }
        }
        else {
          ppvVar6 = pVVar5->pArray;
        }
        uVar13 = (int)local_38 + 1;
        pVVar5->nSize = uVar13;
        ppvVar6[(int)local_38] = puVar12;
        uVar22 = (ulong)uVar13;
        uVar4 = uVar4 + 1;
      }
      else {
        if (((int)uVar3 < 0) || ((int)uVar13 <= (int)uVar3)) goto LAB_006c77d5;
        uVar19 = (ulong)uVar3;
        Vec_IntPush(*(Vec_Int_t **)(*(long *)(__ptr + 2) + uVar19 * 8),iVar2);
        if ((int)uVar4 <= (int)uVar3) goto LAB_006c77d5;
        ppvVar6 = pVVar8->pArray;
        pVVar10 = (Vec_Int_t *)ppvVar6[uVar19];
        local_68 = Vec_IntTwoMerge(pVVar10,pVVar17);
        if (pVVar10->pArray != (int *)0x0) {
          free(pVVar10->pArray);
        }
        free(pVVar10);
        uVar22 = local_38;
        pVVar5 = local_48;
        ppvVar6[uVar19] = local_68;
        if ((int)local_38 <= (int)uVar3) goto LAB_006c77d5;
        Aig_ManSuppCharAdd((uint *)local_48->pArray[uVar19],pVVar17,nPis);
        pVVar8 = local_40;
        uVar3 = uVar13;
      }
      uVar19 = (ulong)uVar4;
      vPartsAll = (Vec_Ptr_t *)((long)&local_60->nCap + 1);
      uVar13 = uVar3;
    } while (pVVar18 != vPartsAll);
    ppvVar6 = pVVar5->pArray;
    if ((int)uVar22 < 1) goto LAB_006c74e4;
    uVar23 = 0;
    do {
      if (ppvVar6[uVar23] != (void *)0x0) {
        free(ppvVar6[uVar23]);
      }
      uVar23 = uVar23 + 1;
    } while ((uVar22 & 0xffffffff) != uVar23);
LAB_006c74e9:
    free(ppvVar6);
  }
  free(pVVar5);
  if (fVerbose != 0) {
    Abc_Print((int)pVVar5,"%s =","Parts");
    iVar20 = 3;
    iVar2 = clock_gettime(3,&local_98);
    if (iVar2 < 0) {
      lVar14 = -1;
    }
    else {
      lVar14 = local_98.tv_nsec / 1000 + local_98.tv_sec * 1000000;
    }
    Abc_Print(iVar20,"%9.2f sec\n",(double)(lVar14 + local_58) / 1000000.0);
  }
  clock_gettime(3,&local_98);
  ppvVar6 = pVVar8->pArray;
  iVar2 = (int)uVar19;
  if (0 < iVar2) {
    uVar22 = 0;
    do {
      Vec_IntPush((Vec_Int_t *)ppvVar6[uVar22],(int)uVar22);
      uVar22 = uVar22 + 1;
    } while (uVar19 != uVar22);
  }
  qsort(ppvVar6,(long)iVar2,8,Vec_VecSortCompare2);
  pVVar5 = (Vec_Ptr_t *)malloc(0x10);
  pVVar5->nCap = 0x100;
  pVVar5->nSize = 0;
  ppvVar6 = (void **)malloc(0x800);
  pVVar5->pArray = ppvVar6;
  if (0 < iVar2) {
    uVar23 = 0x100;
    uVar22 = 0;
    do {
      pvVar7 = pVVar8->pArray[uVar22];
      if (*(int *)((long)pvVar7 + 4) < 1) {
LAB_006c77f4:
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x3bc,"int Vec_IntPop(Vec_Int_t *)");
      }
      uVar4 = *(int *)((long)pvVar7 + 4) - 1;
      *(uint *)((long)pvVar7 + 4) = uVar4;
      iVar20 = *(int *)(*(long *)((long)pvVar7 + 8) + (ulong)uVar4 * 4);
      if (((long)iVar20 < 0) || ((int)uVar3 <= iVar20)) {
LAB_006c77d5:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar7 = *(void **)(*(long *)(__ptr + 2) + (long)iVar20 * 8);
      iVar20 = (int)uVar23;
      if ((int)uVar22 == iVar20) {
        if (iVar20 < 0x10) {
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(0x80);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,0x80);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = 0x10;
          uVar23 = 0x10;
        }
        else {
          uVar23 = (ulong)(uint)(iVar20 * 2);
          if (pVVar5->pArray == (void **)0x0) {
            ppvVar6 = (void **)malloc(uVar23 * 8);
          }
          else {
            ppvVar6 = (void **)realloc(pVVar5->pArray,uVar23 * 8);
          }
          pVVar5->pArray = ppvVar6;
          pVVar5->nCap = iVar20 * 2;
        }
      }
      else {
        ppvVar6 = pVVar5->pArray;
      }
      uVar1 = uVar22 + 1;
      pVVar5->nSize = (int)uVar1;
      ppvVar6[uVar22] = pvVar7;
      uVar22 = uVar1;
      pVVar8 = local_40;
    } while (uVar19 != uVar1);
  }
  if (*(void **)(__ptr + 2) != (void *)0x0) {
    free(*(void **)(__ptr + 2));
  }
  free(__ptr);
  Aig_ManPartitionCompact(pVVar5,pVVar8,local_84);
  if (fVerbose != 0) {
    printf("Created %d partitions.\n",(ulong)(uint)pVVar5->nSize);
  }
  ppvVar6 = local_70->pArray;
  if ((int)nPis < 1) {
    if (ppvVar6 != (void **)0x0) goto LAB_006c775d;
  }
  else {
    pVVar8 = (Vec_Ptr_t *)0x0;
    do {
      pvVar7 = ppvVar6[(long)pVVar8];
      if (pvVar7 != (void *)0x0) {
        if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar7 + 8));
        }
        free(pvVar7);
      }
      pVVar8 = (Vec_Ptr_t *)((long)&pVVar8->nCap + 1);
    } while (pVVar18 != pVVar8);
LAB_006c775d:
    free(ppvVar6);
  }
  free(local_70);
  pVVar18 = local_40;
  ppvVar6 = local_40->pArray;
  if (iVar2 < 1) {
    if (ppvVar6 == (void **)0x0) goto LAB_006c77b8;
  }
  else {
    uVar22 = 0;
    do {
      pvVar7 = ppvVar6[uVar22];
      if (pvVar7 != (void *)0x0) {
        if (*(void **)((long)pvVar7 + 8) != (void *)0x0) {
          free(*(void **)((long)pvVar7 + 8));
        }
        free(pvVar7);
      }
      uVar22 = uVar22 + 1;
    } while (uVar19 != uVar22);
  }
  free(ppvVar6);
LAB_006c77b8:
  free(pVVar18);
  return pVVar5;
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmartRegisters( Aig_Man_t * pAig, int nSuppSizeLimit, int fVerbose )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // add output number to each
clk = Abc_Clock();
    vSupports = Aig_ManSupportsRegisters( pAig );
    assert( Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
        Vec_IntPush( vOne, i );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}

    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Vec_PtrSize(vSupports)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Vec_PtrSize(vSupports) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
//    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
//    else
//        *pvPartSupps = vPartSuppsAll;

/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}